

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O2

int32_t __thiscall helics::EndpointInfo::queueSizeUpTo(EndpointInfo *this,Time maxTime)

{
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *msg;
  _Elt_pointer puVar1;
  _Map_pointer ppuVar2;
  int iVar3;
  _Elt_pointer puVar4;
  shared_handle handle;
  shared_handle local_30;
  
  gmlc::libguarded::
  shared_guarded<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
  ::lock_shared(&local_30,&this->message_queue);
  puVar1 = ((local_30.data)->
           super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  puVar4 = ((local_30.data)->
           super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_last;
  ppuVar2 = ((local_30.data)->
            super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
            )._M_impl.super__Deque_impl_data._M_start._M_node;
  iVar3 = 0;
  while ((puVar1 != ((local_30.data)->
                    super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                    )._M_impl.super__Deque_impl_data._M_finish._M_cur &&
         ((((puVar1->_M_t).
            super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
            super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->time).internalTimeCode <
          maxTime.internalTimeCode))) {
    iVar3 = iVar3 + 1;
    puVar1 = puVar1 + 1;
    if (puVar1 == puVar4) {
      puVar1 = ppuVar2[1];
      ppuVar2 = ppuVar2 + 1;
      puVar4 = puVar1 + 0x40;
    }
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_30.m_handle_lock);
  return iVar3;
}

Assistant:

int32_t EndpointInfo::queueSizeUpTo(Time maxTime) const
{
    auto handle = message_queue.lock_shared();
    int32_t cnt = 0;
    for (const auto& msg : *handle) {
        if (msg->time < maxTime) {
            ++cnt;
        } else {
            break;
        }
    }
    return cnt;
}